

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

Quat rw::slerp(Quat *q,Quat *p,float32 a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  Quat QVar7;
  undefined8 local_38;
  
  local_38._0_4_ = (float)q->x;
  local_38._4_4_ = (float)q->y;
  fVar1 = (float)q->z;
  fVar2 = (float)q->w;
  fVar3 = (float)p->z * fVar1 +
          local_38._4_4_ * (float)p->y + fVar2 * (float)p->w + (float)p->x * (float)local_38;
  if (fVar3 < 0.0) {
    fVar3 = -fVar3;
    local_38 = local_38 ^ 0x8000000080000000;
    fVar1 = -fVar1;
    fVar2 = -fVar2;
  }
  fVar3 = acosf(fVar3);
  if (fVar3 <= 1e-05) {
    uVar6 = CONCAT44(fVar2,fVar1);
  }
  else {
    fVar4 = sinf(fVar3);
    fVar5 = sinf((1.0 - (float)a) * fVar3);
    fVar5 = fVar5 / fVar4;
    fVar3 = sinf(fVar3 * (float)a);
    fVar3 = fVar3 / fVar4;
    uVar6 = CONCAT44((float)p->w * fVar3 + fVar2 * fVar5,fVar3 * (float)p->z + fVar5 * fVar1);
    local_38 = CONCAT44((float)p->y * fVar3 + local_38._4_4_ * fVar5,
                        (float)p->x * fVar3 + (float)local_38 * fVar5);
  }
  QVar7.z = (float32)(int)uVar6;
  QVar7.w = (float32)(int)((ulong)uVar6 >> 0x20);
  QVar7.x = (float32)(int)local_38;
  QVar7.y = (float32)(int)(local_38 >> 0x20);
  return QVar7;
}

Assistant:

Quat
slerp(const Quat &q, const Quat &p, float32 a)
{
	float32 c;
	Quat q1 = q;
	c = dot(q1, p);
	if(c < 0.0f){
		c = -c;
		q1 = negate(q1);
	}
	float32 phi = acosf(c);
	if(phi > 0.00001f){
		float32 s = sinf(phi);
		return add(scale(q1, sinf((1.0f-a)*phi)/s),
		           scale(p,  sinf(a*phi)/s));
	}
	return q1;
}